

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsWriter.cpp
# Opt level: O2

void __thiscall adios2::core::engine::MhsWriter::Flush(MhsWriter *this,int transportIndex)

{
  pointer ppEVar1;
  Engine **e;
  pointer ppEVar2;
  
  ppEVar1 = (this->m_SubEngines).
            super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar2 = (this->m_SubEngines).
                 super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1;
      ppEVar2 = ppEVar2 + 1) {
    (*(*ppEVar2)->_vptr_Engine[9])(*ppEVar2,transportIndex);
  }
  return;
}

Assistant:

void MhsWriter::Flush(const int transportIndex)
{
    for (auto &e : m_SubEngines)
    {
        e->Flush(transportIndex);
    }
}